

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

Argument * __thiscall argparse::Argument::default_value<int>(Argument *this,int *value)

{
  string local_38;
  
  NArgsRange::NArgsRange((NArgsRange *)&local_38,0,(this->m_num_args_range).m_max);
  (this->m_num_args_range).m_min = (size_t)local_38._M_dataplus._M_p;
  (this->m_num_args_range).m_max = local_38._M_string_length;
  details::repr<int>(&local_38,value);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_default_value_repr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::to_string(&local_38,*value);
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)&this->m_default_value_str,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::any::operator=(&this->m_default_value,value);
  return this;
}

Assistant:

Argument &default_value(T &&value) {
    m_num_args_range = NArgsRange{0, m_num_args_range.get_max()};
    m_default_value_repr = details::repr(value);

    if constexpr (std::is_convertible_v<T, std::string_view>) {
      m_default_value_str = std::string{std::string_view{value}};
    } else if constexpr (details::can_invoke_to_string<T>::value) {
      m_default_value_str = std::to_string(value);
    }

    m_default_value = std::forward<T>(value);
    return *this;
  }